

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O0

void __thiscall
Clasp::WeightConstraint::addWatch(WeightConstraint *this,Solver *s,uint32 idx,ActiveConstraint c)

{
  uint in_ECX;
  uint32 in_EDX;
  Constraint *in_RSI;
  Solver *in_RDI;
  Literal unaff_retaddr;
  Literal *in_stack_ffffffffffffffc8;
  
  if ((in_ECX ^ 1) != ((in_RDI->model).ebo_.size >> 0x1c & 3)) {
    lit((WeightConstraint *)in_RDI,(uint32)((ulong)in_RSI >> 0x20),(ActiveConstraint)in_RSI);
    Literal::operator~(in_stack_ffffffffffffffc8);
    Solver::addWatch(in_RDI,unaff_retaddr,in_RSI,in_EDX);
  }
  return;
}

Assistant:

void WeightConstraint::addWatch(Solver& s, uint32 idx, ActiveConstraint c) {
	// Add watch only if c is relevant.
	if (uint32(c^1) != active_) {
		// Use LSB to store the constraint that watches the literal.
		s.addWatch(~lit(idx, c), this, (idx<<1)+c);
	}
}